

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O2

int header_newc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  void *__s1;
  dev_t dVar5;
  int64_t iVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *p;
  ulong uVar10;
  ssize_t bytes;
  
  lVar4 = 0;
  while( true ) {
    pcVar3 = (char *)__archive_read_ahead(a,0x6e,&bytes);
    if (pcVar3 == (char *)0x0) {
      return -0x1e;
    }
    pcVar9 = pcVar3 + bytes;
    iVar1 = bcmp("07070",pcVar3,5);
    p = pcVar3;
    if (((iVar1 == 0) && ((byte)(pcVar3[5] - 0x31U) < 2)) &&
       (iVar1 = is_hex(pcVar3,0x6e), iVar1 != 0)) break;
    for (; p + 0x6e <= pcVar9; p = p + lVar8) {
      if ((byte)p[5] - 0x31 < 2) {
        iVar1 = bcmp("07070",p,5);
        lVar8 = 2;
        if ((iVar1 == 0) && (iVar1 = is_hex(p,0x6e), iVar1 != 0)) {
          __archive_read_consume(a,(long)p - (long)pcVar3);
          uVar10 = ((long)p - (long)pcVar3) + lVar4;
          if (uVar10 == 0) {
            iVar1 = 0;
          }
          else {
            archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                              uVar10 & 0xffffffff);
            iVar1 = -0x14;
          }
          goto LAB_00232aa0;
        }
      }
      else {
        lVar8 = 1;
        if (p[5] != 0x30) {
          lVar8 = 6;
        }
      }
    }
    __archive_read_consume(a,(long)p - (long)pcVar3);
    lVar4 = lVar4 + ((long)p - (long)pcVar3);
  }
  iVar1 = 0;
LAB_00232aa0:
  __s1 = __archive_read_ahead(a,0x6e,(ssize_t *)0x0);
  if (__s1 == (void *)0x0) {
    return -0x1e;
  }
  iVar2 = bcmp(__s1,"070701",6);
  if (iVar2 == 0) {
    pcVar3 = "ASCII cpio (SVR4 with no CRC)";
    iVar2 = 0x10004;
  }
  else {
    iVar2 = bcmp(__s1,"070702",6);
    if (iVar2 != 0) goto LAB_00232b0e;
    pcVar3 = "ASCII cpio (SVR4 with CRC)";
    iVar2 = 0x10005;
  }
  (a->archive).archive_format = iVar2;
  (a->archive).archive_format_name = pcVar3;
LAB_00232b0e:
  dVar5 = atol16((char *)((long)__s1 + 0x3e),8);
  archive_entry_set_devmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)__s1 + 0x46),8);
  archive_entry_set_devminor(entry,dVar5);
  iVar6 = atol16((char *)((long)__s1 + 6),8);
  archive_entry_set_ino(entry,iVar6);
  iVar6 = atol16((char *)((long)__s1 + 0xe),8);
  archive_entry_set_mode(entry,(mode_t)iVar6);
  iVar6 = atol16((char *)((long)__s1 + 0x16),8);
  archive_entry_set_uid(entry,iVar6);
  iVar6 = atol16((char *)((long)__s1 + 0x1e),8);
  archive_entry_set_gid(entry,iVar6);
  iVar6 = atol16((char *)((long)__s1 + 0x26),8);
  archive_entry_set_nlink(entry,(uint)iVar6);
  dVar5 = atol16((char *)((long)__s1 + 0x4e),8);
  archive_entry_set_rdevmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)__s1 + 0x56),8);
  archive_entry_set_rdevminor(entry,dVar5);
  iVar6 = atol16((char *)((long)__s1 + 0x2e),8);
  archive_entry_set_mtime(entry,iVar6,0);
  sVar7 = atol16((char *)((long)__s1 + 0x5e),8);
  *namelength = sVar7;
  uVar10 = (ulong)(2U - (int)sVar7 & 3);
  *name_pad = uVar10;
  if (CARRY8(uVar10,*namelength)) {
    archive_set_error(&a->archive,0x54,"cpio archive has invalid namelength",uVar10 + *namelength);
    return -0x1e;
  }
  iVar6 = atol16((char *)((long)__s1 + 0x36),8);
  cpio->entry_bytes_remaining = iVar6;
  archive_entry_set_size(entry,iVar6);
  cpio->entry_padding = (ulong)(-(int)cpio->entry_bytes_remaining & 3);
  __archive_read_consume(a,0x6e);
  return iVar1;
}

Assistant:

static int
header_newc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const char *header;
	int r;

	r = find_newc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, newc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out hex fields. */
	header = (const char *)h;

	if (memcmp(header + newc_magic_offset, "070701", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_NOCRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with no CRC)";
	} else if (memcmp(header + newc_magic_offset, "070702", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_CRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with CRC)";
	} else {
		/* TODO: Abort here? */
	}

	archive_entry_set_devmajor(entry,
		(dev_t)atol16(header + newc_devmajor_offset, newc_devmajor_size));
	archive_entry_set_devminor(entry, 
		(dev_t)atol16(header + newc_devminor_offset, newc_devminor_size));
	archive_entry_set_ino(entry, atol16(header + newc_ino_offset, newc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol16(header + newc_mode_offset, newc_mode_size));
	archive_entry_set_uid(entry, atol16(header + newc_uid_offset, newc_uid_size));
	archive_entry_set_gid(entry, atol16(header + newc_gid_offset, newc_gid_size));
	archive_entry_set_nlink(entry,
		(unsigned int)atol16(header + newc_nlink_offset, newc_nlink_size));
	archive_entry_set_rdevmajor(entry,
		(dev_t)atol16(header + newc_rdevmajor_offset, newc_rdevmajor_size));
	archive_entry_set_rdevminor(entry,
		(dev_t)atol16(header + newc_rdevminor_offset, newc_rdevminor_size));
	archive_entry_set_mtime(entry, atol16(header + newc_mtime_offset, newc_mtime_size), 0);
	*namelength = (size_t)atol16(header + newc_namesize_offset, newc_namesize_size);
	/* Pad name to 2 more than a multiple of 4. */
	*name_pad = (2 - *namelength) & 3;

	/* Make sure that the padded name length fits into size_t. */
	if (*name_pad > SIZE_MAX - *namelength) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "cpio archive has invalid namelength");
		return (ARCHIVE_FATAL);
	}

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol16(header + newc_filesize_offset, newc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	/* Pad file contents to a multiple of 4. */
	cpio->entry_padding = 3 & -cpio->entry_bytes_remaining;
	__archive_read_consume(a, newc_header_size);
	return (r);
}